

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 *__ptr;
  stbi__uint16 *image;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    image = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel == 8) {
      iVar1 = req_comp;
      if (req_comp == 0) {
        iVar1 = *comp;
      }
      uVar3 = *y * *x * iVar1;
      image = (stbi__uint16 *)malloc((long)(int)(uVar3 * 2));
      if (image == (stbi__uint16 *)0x0) {
        stbi__g_failure_reason = "outofmem";
      }
      else {
        if (0 < (int)uVar3) {
          uVar2 = 0;
          do {
            image[uVar2] = CONCAT11(*(undefined1 *)((long)__ptr + uVar2),
                                    *(undefined1 *)((long)__ptr + uVar2));
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
        free(__ptr);
      }
    }
    else {
      image = __ptr;
      if (local_3c.bits_per_channel != 0x10) {
        __assert_fail("ri.bits_per_channel == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/stb/stb_image.cpp"
                      ,0x29a,
                      "stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
    }
    if (stbi__vertically_flip_on_load != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(image,*x,*y,req_comp * 2);
    }
  }
  return image;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 16) {
      STBI_ASSERT(ri.bits_per_channel == 8);
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}